

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

UINT8 k053260_read(void *chip,UINT8 offset)

{
  byte bVar1;
  int local_28;
  byte local_21;
  int i;
  UINT8 ret;
  k053260_state *info;
  UINT8 offset_local;
  void *chip_local;
  
  bVar1 = offset & 0x3f;
  local_21 = 0;
  if (bVar1 < 2) {
    local_21 = *(byte *)((long)chip + (ulong)bVar1 + 0x20);
  }
  else if (bVar1 == 0x29) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      local_21 = local_21 |
                 *(char *)((long)chip + (long)local_28 * 0x28 + 0x3f) << ((byte)local_28 & 0x1f);
    }
  }
  else if (bVar1 == 0x2e) {
    if ((*(byte *)((long)chip + 0x25) & 1) == 0) {
      emu_logf((DEV_LOGGER *)((long)chip + 8),'\x02',"Attempting to read ROM without mode bit set\n"
              );
    }
    else {
      local_21 = KDSC_read_rom((KDSC_Voice *)((long)chip + 0x28));
    }
  }
  else {
    emu_logf((DEV_LOGGER *)((long)chip + 8),'\x04',"Read from unknown register %02x\n",(ulong)bVar1)
    ;
  }
  return local_21;
}

Assistant:

static UINT8 k053260_read(void* chip, UINT8 offset)
{
	k053260_state *info = (k053260_state *)chip;
	UINT8 ret;
	int i;

	offset &= 0x3f;
	ret = 0;

	switch (offset)
	{
		case 0x00: // main-to-sub ports
		case 0x01:
			ret = info->portdata[offset];
			break;

		case 0x29: // voice status
			for (i = 0; i < 4; i++)
				ret |= info->voice[i].playing << i;
			break;

		case 0x2e: // read ROM
			if (info->mode & 1)
				ret = KDSC_read_rom(&info->voice[0]);
			else
				emu_logf(&info->logger, DEVLOG_WARN, "Attempting to read ROM without mode bit set\n");
			break;

		default:
			emu_logf(&info->logger, DEVLOG_DEBUG, "Read from unknown register %02x\n", offset);
	}
	return ret;
}